

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

void If_ManDerefChoiceCutSet(If_Man_t *p,If_Obj_t *pObj)

{
  int *piVar1;
  If_Set_t *pIVar2;
  
  if ((*(uint *)pObj & 0xf) != 4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x298,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
  }
  if ((char)*(uint *)pObj < '\0') {
    if (pObj->nVisits < 1) {
      __assert_fail("pObj->nVisits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                    ,0x29a,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
    }
    for (; pObj != (If_Obj_t *)0x0; pObj = pObj->pEquiv) {
      piVar1 = &pObj->nVisits;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pIVar2 = pObj->pCutSet;
        pIVar2->pNext = p->pFreeList;
        p->pFreeList = pIVar2;
        pObj->pCutSet = (If_Set_t *)0x0;
      }
    }
    return;
  }
  __assert_fail("pObj->fRepr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x299,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManDerefChoiceCutSet( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pTemp;
    assert( If_ObjIsAnd(pObj) );
    assert( pObj->fRepr );
    assert( pObj->nVisits > 0 );
    // consider the nodes in the choice class
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
//        assert( pTemp == pObj || pTemp->nVisits == 1 );
        if ( --pTemp->nVisits == 0 )
        {
//            Mem_FixedEntryRecycle( p->pMemSet, (char *)pTemp->pCutSet );
            If_ManCutSetRecycle( p, pTemp->pCutSet );
            pTemp->pCutSet = NULL;
        }
    }
}